

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O3

void __thiscall
xLearn::FFMScore::calc_grad_sgd(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  uint *puVar11;
  uint uVar12;
  uint *puVar13;
  int iVar14;
  uint uVar15;
  uint *puVar16;
  ulong uVar17;
  uint *puVar18;
  uint *puVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar22 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar27 [16];
  
  auVar26 = in_ZMM4._0_16_;
  auVar23._4_60_ = in_register_00001244;
  auVar23._0_4_ = norm;
  auVar22._4_60_ = in_register_00001204;
  auVar22._0_4_ = pg;
  auVar21 = auVar22._0_16_;
  if (norm < 0.0) {
    fVar20 = sqrtf(norm);
    auVar21 = ZEXT416((uint)pg);
    auVar23 = ZEXT464((uint)norm);
  }
  else {
    auVar24 = vsqrtss_avx(auVar23._0_16_,auVar23._0_16_);
    fVar20 = auVar24._0_4_;
  }
  uVar5 = *(uint *)(model + 0x48);
  uVar6 = *(uint *)(model + 0x4c);
  puVar11 = *(uint **)row;
  puVar13 = *(uint **)(row + 8);
  if (puVar11 != puVar13) {
    lVar9 = *(long *)(model + 0x58);
    puVar16 = puVar11;
    do {
      uVar15 = puVar16[1];
      if (uVar15 < uVar5) {
        auVar25 = ZEXT416(*(uint *)(lVar9 + (ulong)uVar15 * 4));
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * auVar21._0_4_ * (float)puVar16[2])),
                                  auVar25,ZEXT416((uint)(this->super_Score).regu_lambda_));
        auVar24 = vfnmadd132ss_fma(auVar24,auVar25,ZEXT416((uint)(this->super_Score).learning_rate_)
                                  );
        *(int *)(lVar9 + (ulong)uVar15 * 4) = auVar24._0_4_;
      }
      puVar16 = puVar16 + 3;
    } while (puVar16 != puVar13);
  }
  auVar24 = vfnmadd213ss_fma(ZEXT416((uint)(this->super_Score).learning_rate_),auVar21,
                             ZEXT416(**(uint **)(model + 0x68)));
  **(uint **)(model + 0x68) = auVar24._0_4_;
  if (puVar11 != puVar13) {
    auVar25 = vcvtusi2ss_avx512f(auVar26,*(undefined4 *)(model + 0x54));
    fVar20 = (this->super_Score).regu_lambda_;
    lVar9 = *(long *)(model + 0x60);
    auVar24 = vcvtusi2ss_avx512f(auVar26,*(undefined4 *)(model + 0x50));
    auVar24 = ZEXT416((uint)(auVar24._0_4_ * 0.25));
    auVar24 = vroundss_avx(auVar24,auVar24,10);
    iVar14 = vcvttss2usi_avx512f(auVar24);
    auVar26 = vcvtusi2ss_avx512f(auVar26,iVar14 << 2);
    uVar15 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar25._0_4_ * auVar26._0_4_)));
    iVar14 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar25._0_4_ * 4.0)));
    fVar3 = (this->super_Score).learning_rate_;
    do {
      uVar7 = puVar11[1];
      uVar8 = *puVar11;
      if ((uVar8 < uVar6 && uVar7 < uVar5) && (puVar11 + 3 != puVar13)) {
        fVar4 = (float)puVar11[2];
        puVar16 = puVar11 + 3;
        puVar19 = puVar11;
        do {
          puVar18 = puVar16;
          if ((puVar19[3] < uVar6 && puVar19[4] < uVar5) && (uVar15 != 0)) {
            lVar1 = lVar9 + (ulong)(uVar7 * uVar6 * uVar15) * 4 + (ulong)(puVar19[3] * uVar15) * 4;
            lVar2 = lVar9 + (ulong)(uVar8 * uVar15) * 4 + (ulong)(puVar19[4] * uVar6 * uVar15) * 4;
            uVar12 = 0;
            fVar10 = auVar21._0_4_ * fVar4 * (float)puVar19[5] * auVar23._0_4_;
            do {
              uVar17 = (ulong)uVar12;
              auVar26 = *(undefined1 (*) [16])(lVar1 + uVar17 * 4);
              auVar24 = *(undefined1 (*) [16])(lVar2 + uVar17 * 4);
              uVar12 = uVar12 + iVar14;
              auVar25._0_4_ = fVar3 * (fVar20 * auVar26._0_4_ + fVar10 * auVar24._0_4_);
              auVar25._4_4_ = fVar3 * (fVar20 * auVar26._4_4_ + fVar10 * auVar24._4_4_);
              auVar25._8_4_ = fVar3 * (fVar20 * auVar26._8_4_ + fVar10 * auVar24._8_4_);
              auVar25._12_4_ = fVar3 * (fVar20 * auVar26._12_4_ + fVar10 * auVar24._12_4_);
              auVar27._0_4_ = fVar3 * (fVar10 * auVar26._0_4_ + fVar20 * auVar24._0_4_);
              auVar27._4_4_ = fVar3 * (fVar10 * auVar26._4_4_ + fVar20 * auVar24._4_4_);
              auVar27._8_4_ = fVar3 * (fVar10 * auVar26._8_4_ + fVar20 * auVar24._8_4_);
              auVar27._12_4_ = fVar3 * (fVar10 * auVar26._12_4_ + fVar20 * auVar24._12_4_);
              auVar26 = vsubps_avx(auVar26,auVar25);
              auVar24 = vsubps_avx(auVar24,auVar27);
              *(undefined1 (*) [16])(lVar1 + uVar17 * 4) = auVar26;
              *(undefined1 (*) [16])(lVar2 + uVar17 * 4) = auVar24;
            } while (uVar12 < uVar15);
            puVar13 = *(uint **)(row + 8);
          }
          puVar16 = puVar18 + 3;
          puVar19 = puVar18;
        } while (puVar16 != puVar13);
      }
      puVar11 = puVar11 + 3;
    } while (puVar11 != puVar13);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_sgd(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= (learning_rate_ * g);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= (learning_rate_ * g);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = model.GetAuxiliarySize() * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * model.GetAuxiliarySize();
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr, XMMg1));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr, XMMg2));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
      }
    }
  }

}